

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

bool xemmai::t_type_of<xemmai::t_string>::f__equals(t_string *a_self,t_pvalue *a_value)

{
  bool bVar1;
  t_object *ptVar2;
  t_string *a_x;
  undefined1 local_19;
  t_pvalue *a_value_local;
  t_string *a_self_local;
  
  ptVar2 = t_pointer::operator_cast_to_t_object_(&a_value->super_t_pointer);
  bVar1 = f_is<xemmai::t_string>(ptVar2);
  local_19 = false;
  if (bVar1) {
    ptVar2 = t_pointer::operator->(&a_value->super_t_pointer);
    a_x = t_object::f_as<xemmai::t_string>(ptVar2);
    local_19 = t_string::operator==(a_self,a_x);
  }
  return local_19;
}

Assistant:

static bool f__equals(const t_string& a_self, const t_pvalue& a_value)
	{
		return f_is<t_string>(a_value) && a_self == a_value->f_as<t_string>();
	}